

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TextEx(char *text,char *text_end,ImGuiTextFlags flags)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImVec2 text_size;
  ImRect bb;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImRect local_78;
  float local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if (text == text_end) {
      text_end = "";
      text = "";
    }
    if (text_end == (char *)0x0) {
      sVar5 = strlen(text);
      text_end = text + sVar5;
    }
    local_48 = ZEXT416((uint)(pIVar1->DC).CursorPos.x);
    local_58 = ZEXT416((uint)((pIVar1->DC).CursorPos.y + (pIVar1->DC).CurrLineTextBaseOffset));
    fVar10 = (pIVar1->DC).TextWrapPos;
    if (((long)text_end - (long)text < 0x7d1) || (0.0 <= fVar10)) {
      fVar11 = 0.0;
      if (0.0 <= fVar10) {
        fVar11 = CalcWrapWidthForPos(&(pIVar1->DC).CursorPos,fVar10);
      }
      local_88._0_4_ = fVar11;
      local_a0 = CalcTextSize(text,text_end,false,fVar11);
      local_78.Max.x = (float)local_48._0_4_ + local_a0.x;
      local_78.Max.y = (float)local_58._0_4_ + local_a0.y;
      local_78.Min.x = (float)local_48._0_4_;
      local_78.Min.y = (float)local_58._0_4_;
      ItemSize(&local_a0,0.0);
      bVar4 = ItemAdd(&local_78,0,(ImRect *)0x0,0);
      if (bVar4) {
        IVar2.y = local_78.Min.y;
        IVar2.x = local_78.Min.x;
        RenderTextWrapped(IVar2,text,text_end,(float)local_88._0_4_);
      }
    }
    else {
      _local_98 = ZEXT816(0);
      fVar10 = GetTextLineHeight();
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      local_78.Min.x = (float)local_48._0_4_;
      fVar11 = (float)local_58._0_4_;
      uVar12 = local_48._4_4_;
      uVar13 = local_58._4_4_;
      local_78.Min.y = (float)local_58._0_4_;
      if ((pIVar3->LogEnabled == false) &&
         (iVar7 = (int)(((pIVar1->ClipRect).Min.y - (float)local_58._0_4_) / fVar10), 0 < iVar7)) {
        if (text < text_end) {
          local_88._4_4_ = local_58._0_4_;
          local_88._0_4_ = local_48._0_4_;
          uStack_80 = local_48._4_4_;
          uStack_7c = local_58._4_4_;
          _local_98 = ZEXT816(0);
          iVar8 = 0;
          local_68 = fVar10;
          do {
            pcVar6 = (char *)memchr(text,10,(long)text_end - (long)text);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = text_end;
            }
            if ((flags & 1U) == 0) {
              IVar2 = CalcTextSize(text,pcVar6,false,-1.0);
              uVar9 = -(uint)(IVar2.x <= (float)local_98._0_4_);
              local_98._4_4_ = (uint)IVar2.y & local_98._4_4_;
              local_98._0_4_ = uVar9 & local_98._0_4_ | ~uVar9 & (uint)IVar2.x;
              uStack_90 = extraout_XMM0_Dc & uStack_90;
              uStack_8c = extraout_XMM0_Dd & uStack_8c;
            }
            text = pcVar6 + 1;
            iVar8 = iVar8 + 1;
          } while ((text < text_end) && (iVar8 < iVar7));
          fVar11 = (float)iVar8;
          fVar10 = local_68;
          local_78.Min.x = (float)local_88._0_4_;
          uVar12 = uStack_80;
          uVar13 = uStack_7c;
        }
        else {
          fVar11 = 0.0;
          _local_98 = ZEXT816(0);
        }
        local_a0.x = (float)local_98._0_4_;
        fVar11 = fVar11 * fVar10 + (float)local_58._0_4_;
        local_78.Min.y = (float)local_58._0_4_;
      }
      if (text < text_end) {
        local_78.Max.x = local_78.Min.x + 3.4028235e+38;
        local_78.Max.y = fVar10 + fVar11;
        local_88._0_4_ = local_78.Min.x;
        uStack_80 = uVar12;
        uStack_7c = uVar13;
        local_78.Min.y = fVar11;
        local_68 = fVar10;
        do {
          local_88._4_4_ = fVar11;
          bVar4 = IsClippedEx(&local_78,0);
          if (bVar4) {
            fVar11 = (float)local_88._4_4_;
            break;
          }
          pcVar6 = (char *)memchr(text,10,(long)text_end - (long)text);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = text_end;
          }
          _local_98 = ZEXT416((uint)local_a0.x);
          IVar2 = CalcTextSize(text,pcVar6,false,-1.0);
          uVar9 = -(uint)(IVar2.x <= (float)local_98._0_4_);
          local_a0.x = (float)(uVar9 & local_98._0_4_ | ~uVar9 & (uint)IVar2.x);
          RenderText((ImVec2)local_88,text,pcVar6,false);
          text = pcVar6 + 1;
          local_78.Min.y = local_78.Min.y + local_68;
          local_78.Max.y = local_78.Max.y + local_68;
          fVar11 = (float)local_88._4_4_ + local_68;
        } while (text < text_end);
        fVar10 = 0.0;
        if (text < text_end) {
          local_98._4_4_ = fVar11;
          local_98._0_4_ = local_88._0_4_;
          uStack_90 = uStack_80;
          uStack_8c = uStack_7c;
          iVar7 = 0;
          do {
            pcVar6 = (char *)memchr(text,10,(long)text_end - (long)text);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = text_end;
            }
            if ((flags & 1U) == 0) {
              _local_88 = ZEXT416((uint)local_a0.x);
              IVar2 = CalcTextSize(text,pcVar6,false,-1.0);
              uVar9 = -(uint)(IVar2.x <= (float)local_88._0_4_);
              local_a0.x = (float)(uVar9 & local_88._0_4_ | ~uVar9 & (uint)IVar2.x);
            }
            text = pcVar6 + 1;
            iVar7 = iVar7 + 1;
          } while (text < text_end);
          fVar10 = (float)iVar7;
          fVar11 = (float)local_98._4_4_;
        }
        fVar11 = fVar10 * local_68 + fVar11;
        fVar10 = local_a0.x;
        local_78.Min.y = (float)local_58._0_4_;
      }
      else {
        fVar10 = (float)local_98._0_4_;
      }
      local_a0.y = fVar11 - local_78.Min.y;
      local_78.Min.x = (float)local_48._0_4_;
      local_78.Max.y = (fVar11 - local_78.Min.y) + local_78.Min.y;
      local_78.Max.x = fVar10 + (float)local_48._0_4_;
      ItemSize(&local_a0,0.0);
      ItemAdd(&local_78,0,(ImRect *)0x0,0);
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}